

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void decode_i64_mips16(DisasContext_conflict6 *ctx,int ry,int funct,int16_t offset,int extended)

{
  short local_48;
  short local_44;
  short local_40;
  short local_3c;
  short local_38;
  short local_34;
  short local_30;
  short local_2c;
  int extended_local;
  int16_t offset_local;
  int funct_local;
  int ry_local;
  DisasContext_conflict6 *ctx_local;
  
  switch(funct) {
  case 0:
    check_insn(ctx,4);
    check_mips_64(ctx);
    local_2c = offset;
    if (extended == 0) {
      local_2c = offset << 3;
    }
    gen_ld(ctx,0xdc000000,ry,0x1d,(int)local_2c);
    break;
  case 1:
    check_insn(ctx,4);
    check_mips_64(ctx);
    local_30 = offset;
    if (extended == 0) {
      local_30 = offset << 3;
    }
    gen_st(ctx,0xfc000000,ry,0x1d,(int)local_30);
    break;
  case 2:
    check_insn(ctx,4);
    check_mips_64(ctx);
    local_34 = offset;
    if (extended == 0) {
      local_34 = (short)((ctx->opcode & 0xff) << 3);
    }
    gen_st(ctx,0xfc000000,0x1f,0x1d,(int)local_34);
    break;
  case 3:
    check_insn(ctx,4);
    check_mips_64(ctx);
    local_38 = offset;
    if (extended == 0) {
      local_38 = (short)(char)ctx->opcode << 3;
    }
    gen_arith_imm(ctx,0x64000000,0x1d,0x1d,(int)local_38);
    break;
  case 4:
    check_insn(ctx,4);
    check_mips_64(ctx);
    if ((extended == 0) || ((ctx->hflags & 0x87f800) == 0)) {
      local_3c = offset;
      if (extended == 0) {
        local_3c = offset << 3;
      }
      gen_ld(ctx,0xdc000005,ry,0,(int)local_3c);
    }
    else {
      generate_exception_end(ctx,0x14);
    }
    break;
  case 5:
    check_insn(ctx,4);
    check_mips_64(ctx);
    local_40 = offset;
    if (extended == 0) {
      local_40 = (short)((int)(char)((int)offset << 3) >> 3);
    }
    gen_arith_imm(ctx,0x64000000,ry,ry,(int)local_40);
    break;
  case 6:
    check_insn(ctx,4);
    check_mips_64(ctx);
    local_44 = offset;
    if (extended == 0) {
      local_44 = offset << 2;
    }
    gen_addiupc(ctx,ry,(int)local_44,1,extended);
    break;
  case 7:
    check_insn(ctx,4);
    check_mips_64(ctx);
    local_48 = offset;
    if (extended == 0) {
      local_48 = offset << 2;
    }
    gen_arith_imm(ctx,0x64000000,ry,0x1d,(int)local_48);
  }
  return;
}

Assistant:

static void decode_i64_mips16(DisasContext *ctx,
                              int ry, int funct, int16_t offset,
                              int extended)
{
    switch (funct) {
    case I64_LDSP:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        offset = extended ? offset : offset << 3;
        gen_ld(ctx, OPC_LD, ry, 29, offset);
        break;
    case I64_SDSP:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        offset = extended ? offset : offset << 3;
        gen_st(ctx, OPC_SD, ry, 29, offset);
        break;
    case I64_SDRASP:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        offset = extended ? offset : (ctx->opcode & 0xff) << 3;
        gen_st(ctx, OPC_SD, 31, 29, offset);
        break;
    case I64_DADJSP:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        offset = extended ? offset : ((int8_t)ctx->opcode) << 3;
        gen_arith_imm(ctx, OPC_DADDIU, 29, 29, offset);
        break;
    case I64_LDPC:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        if (extended && (ctx->hflags & MIPS_HFLAG_BMASK)) {
            generate_exception_end(ctx, EXCP_RI);
        } else {
            offset = extended ? offset : offset << 3;
            gen_ld(ctx, OPC_LDPC, ry, 0, offset);
        }
        break;
    case I64_DADDIU5:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        offset = extended ? offset : ((int8_t)(offset << 3)) >> 3;
        gen_arith_imm(ctx, OPC_DADDIU, ry, ry, offset);
        break;
    case I64_DADDIUPC:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        offset = extended ? offset : offset << 2;
        gen_addiupc(ctx, ry, offset, 1, extended);
        break;
    case I64_DADDIUSP:
        check_insn(ctx, ISA_MIPS3);
        check_mips_64(ctx);
        offset = extended ? offset : offset << 2;
        gen_arith_imm(ctx, OPC_DADDIU, ry, 29, offset);
        break;
    }
}